

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CType * lj_ctype_getfieldq(CTState *cts,CType *ct,GCstr *name,CTSize *ofs,CTInfo *qual)

{
  ushort uVar1;
  CType *pCVar2;
  CTSize CVar3;
  CType *pCVar4;
  
  uVar1 = ct->sib;
  if (uVar1 != 0) {
    pCVar2 = cts->tab;
    do {
      pCVar4 = pCVar2 + uVar1;
      if ((GCstr *)(ulong)pCVar2[uVar1].name.gcptr32 == name) {
        CVar3 = pCVar4->size;
LAB_0013d167:
        *ofs = CVar3;
        return pCVar4;
      }
      if ((pCVar4->info & 0xf0ff0000) == 0x80030000) {
        pCVar2 = lj_ctype_getfieldq(cts,(CType *)((long)&pCVar2->info +
                                                 (ulong)((pCVar4->info & 0xffff) << 4)),name,ofs,
                                    qual);
        if (pCVar2 != (CType *)0x0) {
          if (qual != (CTInfo *)0x0) {
            *qual = *qual;
          }
          CVar3 = *ofs + pCVar4->size;
          pCVar4 = pCVar2;
          goto LAB_0013d167;
        }
        pCVar2 = cts->tab;
      }
      uVar1 = pCVar4->sib;
    } while (uVar1 != 0);
  }
  return (CType *)0x0;
}

Assistant:

CType *lj_ctype_getfieldq(CTState *cts, CType *ct, GCstr *name, CTSize *ofs,
			  CTInfo *qual)
{
  while (ct->sib) {
    ct = ctype_get(cts, ct->sib);
    if (gcref(ct->name) == obj2gco(name)) {
      *ofs = ct->size;
      return ct;
    }
    if (ctype_isxattrib(ct->info, CTA_SUBTYPE)) {
      CType *fct, *cct = ctype_child(cts, ct);
      CTInfo q = 0;
      while (ctype_isattrib(cct->info)) {
	if (ctype_attrib(cct->info) == CTA_QUAL) q |= cct->size;
	cct = ctype_child(cts, cct);
      }
      fct = lj_ctype_getfieldq(cts, cct, name, ofs, qual);
      if (fct) {
	if (qual) *qual |= q;
	*ofs += ct->size;
	return fct;
      }
    }
  }
  return NULL;  /* Not found. */
}